

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

char __thiscall AggressiveBotStrategy::yesOrNo(AggressiveBotStrategy *this,StrategyContext context)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  
  if (context == REINFORCE) {
    cVar2 = 'y';
  }
  else {
    if (context == FORTIFY) {
      bVar1 = canFortify(this);
    }
    else {
      if (context != ATTACK) {
        cVar2 = 'n';
        goto LAB_0010955a;
      }
      bVar1 = canAttack(this);
    }
    cVar2 = 'n';
    if (bVar1 != false) {
      cVar2 = 'y';
    }
  }
LAB_0010955a:
  poVar3 = std::operator<<((ostream *)&std::cout,cVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  return cVar2;
}

Assistant:

signed char AggressiveBotStrategy::yesOrNo(StrategyContext context) {
    char botChoice = 0;
    switch ((int) context) {
        case StrategyContext::ATTACK:
            botChoice = canAttack() ? 'y' : 'n';
            break;
        case StrategyContext::FORTIFY:
            botChoice = canFortify() ? 'y' : 'n';
            break;
        case StrategyContext::REINFORCE:
            botChoice = 'y';
            break;
        default: {
            // Should never occur
            botChoice = 'n';
        }
    }
    std::cout << botChoice << std::endl;
    return botChoice;
}